

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O1

void __thiscall
duckdb::HistogramBinState<unsigned_char>::InitializeBins<duckdb::HistogramFunctor>
          (HistogramBinState<unsigned_char> *this,Vector *bin_vector,idx_t count,idx_t pos,
          AggregateInputData *aggr_input)

{
  pointer __src;
  size_type __n;
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  iterator __position;
  unsafe_vector<unsigned_char> *puVar2;
  unsafe_vector<idx_t> *puVar3;
  ulong uVar4;
  UnifiedVectorFormat *pUVar5;
  BinderException *pBVar6;
  pointer puVar7;
  pointer puVar8;
  size_type sVar9;
  ulong uVar10;
  pointer *ppuVar11;
  UnifiedVectorFormat bin_child_data;
  UnifiedVectorFormat bin_data;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  puVar2 = (unsafe_vector<unsigned_char> *)operator_new(0x18);
  (puVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (puVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (puVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->bin_boundaries = puVar2;
  puVar3 = (unsafe_vector<idx_t> *)operator_new(0x18);
  (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->counts = puVar3;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)bin_vector,(UnifiedVectorFormat *)count);
  if (*local_78 != 0) {
    pos = (idx_t)*(uint *)(*local_78 + pos * 4);
  }
  uVar10 = *(ulong *)(local_70 + pos * 0x10);
  __n = *(size_type *)(local_70 + 8 + pos * 0x10);
  if ((local_68 != 0) && ((*(ulong *)(local_68 + (pos >> 6) * 8) >> (pos & 0x3f) & 1) == 0)) {
    pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
    local_c0 = local_b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"Histogram bin list cannot be NULL","");
    duckdb::BinderException::BinderException(pBVar6,(string *)&local_c0);
    __cxa_throw(pBVar6,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar4 = duckdb::ListVector::GetEntry(bin_vector);
  pUVar5 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(bin_vector);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::Vector::ToUnifiedFormat(uVar4,pUVar5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&this->bin_boundaries->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,__n)
  ;
  if (__n != 0) {
    sVar9 = __n;
    do {
      lVar1 = *local_c0;
      uVar4 = uVar10;
      if (lVar1 != 0) {
        uVar4 = (ulong)*(uint *)(lVar1 + uVar10 * 4);
      }
      if (local_b0[0] != 0) {
        if ((*(ulong *)(local_b0[0] + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) == 0) {
          pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
          local_e0[0] = local_d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e0,"Histogram bin entry cannot be NULL","");
          duckdb::BinderException::BinderException(pBVar6,(string *)local_e0);
          __cxa_throw(pBVar6,&BinderException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      uVar4 = uVar10;
      if (lVar1 != 0) {
        uVar4 = (ulong)*(uint *)(lVar1 + uVar10 * 4);
      }
      this_00 = &this->bin_boundaries->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_e0[0] = (undefined1 *)CONCAT71(local_e0[0]._1_7_,*(uchar *)(local_b8 + uVar4));
      __position._M_current =
           (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (this_00,__position,(uchar *)local_e0);
      }
      else {
        *__position._M_current = *(uchar *)(local_b8 + uVar4);
        ppuVar11 = &(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar11 = *ppuVar11 + 1;
      }
      uVar10 = uVar10 + 1;
      sVar9 = sVar9 - 1;
    } while (sVar9 != 0);
  }
  puVar8 = (this->bin_boundaries->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (this->bin_boundaries->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar8 != puVar7) {
    lVar1 = 0x3f;
    if ((long)puVar7 - (long)puVar8 != 0) {
      for (; (ulong)((long)puVar7 - (long)puVar8) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar8,puVar7,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar8,puVar7);
  }
  puVar2 = this->bin_boundaries;
  puVar8 = (puVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (puVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (1 < (ulong)((long)puVar7 - (long)puVar8)) {
    uVar10 = 1;
    do {
      ppuVar11 = &(puVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      if (puVar8[uVar10 + -1] == puVar8[uVar10]) {
        __src = puVar8 + uVar10 + 1;
        if (__src != puVar7) {
          memmove(puVar8 + uVar10,__src,(long)puVar7 - (long)__src);
        }
        uVar10 = uVar10 - 1;
        *ppuVar11 = *ppuVar11 + -1;
      }
      uVar10 = uVar10 + 1;
      puVar2 = this->bin_boundaries;
      puVar8 = (puVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar7 = (puVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (uVar10 < (ulong)((long)puVar7 - (long)puVar8));
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,__n + 1);
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

void InitializeBins(Vector &bin_vector, idx_t count, idx_t pos, AggregateInputData &aggr_input) {
		bin_boundaries = new unsafe_vector<T>();
		counts = new unsafe_vector<idx_t>();
		UnifiedVectorFormat bin_data;
		bin_vector.ToUnifiedFormat(count, bin_data);
		auto bin_counts = UnifiedVectorFormat::GetData<list_entry_t>(bin_data);
		auto bin_index = bin_data.sel->get_index(pos);
		auto bin_list = bin_counts[bin_index];
		if (!bin_data.validity.RowIsValid(bin_index)) {
			throw BinderException("Histogram bin list cannot be NULL");
		}

		auto &bin_child = ListVector::GetEntry(bin_vector);
		auto bin_count = ListVector::GetListSize(bin_vector);
		UnifiedVectorFormat bin_child_data;
		auto extra_state = OP::CreateExtraState(bin_count);
		OP::PrepareData(bin_child, bin_count, extra_state, bin_child_data);

		bin_boundaries->reserve(bin_list.length);
		for (idx_t i = 0; i < bin_list.length; i++) {
			auto bin_child_idx = bin_child_data.sel->get_index(bin_list.offset + i);
			if (!bin_child_data.validity.RowIsValid(bin_child_idx)) {
				throw BinderException("Histogram bin entry cannot be NULL");
			}
			bin_boundaries->push_back(OP::template ExtractValue<T>(bin_child_data, bin_list.offset + i, aggr_input));
		}
		// sort the bin boundaries
		std::sort(bin_boundaries->begin(), bin_boundaries->end());
		// ensure there are no duplicate bin boundaries
		for (idx_t i = 1; i < bin_boundaries->size(); i++) {
			if (Equals::Operation((*bin_boundaries)[i - 1], (*bin_boundaries)[i])) {
				bin_boundaries->erase_at(i);
				i--;
			}
		}

		counts->resize(bin_list.length + 1);
	}